

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::CBString(CBString *this,CBStringList *l,uchar sep)

{
  uchar c;
  const_reference pvVar1;
  uchar *puVar2;
  CBStringException *this_00;
  undefined7 in_register_00000011;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  allocator local_7d;
  undefined4 local_7c;
  string local_78;
  CBStringException bstr__cppwrapper_exception;
  
  local_7c = (undefined4)CONCAT71(in_register_00000011,sep);
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a1870;
  iVar3 = 1;
  uVar6 = 0;
  while( true ) {
    lVar5 = *(long *)l;
    lVar4 = *(long *)(l + 8);
    if ((ulong)((lVar4 - lVar5) / 0x18) <= uVar6) break;
    pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar6);
    iVar3 = iVar3 + (pvVar1->super_tagbstring).slen + 1;
    uVar6 = uVar6 + 1;
  }
  (this->super_tagbstring).mlen = iVar3;
  (this->super_tagbstring).slen = 0;
  puVar2 = (uchar *)malloc((long)iVar3);
  (this->super_tagbstring).data = puVar2;
  if (puVar2 != (uchar *)0x0) {
    c = (uchar)local_7c;
    for (uVar6 = 0; uVar6 < (ulong)((lVar4 - lVar5) / 0x18); uVar6 = uVar6 + 1) {
      if (uVar6 != 0) {
        operator+=(this,c);
      }
      pvVar1 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                         ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,uVar6);
      operator+=(this,pvVar1);
      lVar5 = *(long *)l;
      lVar4 = *(long *)(l + 8);
    }
    return;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  std::__cxx11::string::string
            ((string *)&local_78,"CBString::Failure in (CBStringList) constructor",&local_7d);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const struct CBStringList& l, unsigned char sep) {
int c;
size_t i;

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + 1;
	}

	mlen = c;
	slen = 0;
	data = (unsigned char *) bstr__alloc (mlen);
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}